

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::SimpleAssignmentPatternExpression::forStruct
          (Compilation *comp,SimpleAssignmentPatternSyntax *syntax,ASTContext *context,Type *type,
          Scope *structScope,SourceRange sourceRange)

{
  Compilation *pCVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  ExpressionSyntax *syntax_00;
  Expression *this;
  Diagnostic *pDVar5;
  undefined4 extraout_var;
  SimpleAssignmentPatternExpression *expr;
  specific_symbol_iterator<slang::ast::FieldSymbol> extraout_RDX;
  specific_symbol_iterator<slang::ast::FieldSymbol> src;
  Symbol *extraout_RDX_00;
  ArgumentDirection direction;
  SimpleAssignmentPatternExpression *ctx;
  ulong uVar7;
  byte bVar8;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar9;
  bool isLValue;
  SmallVector<const_slang::ast::Expression_*,_5UL> elems;
  SmallVector<const_slang::ast::Type_*,_5UL> types;
  bool local_e1;
  Compilation *local_e0;
  ASTContext *local_d8;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_d0;
  SimpleAssignmentPatternExpression *local_c0;
  Expression *local_b8;
  undefined1 local_b0 [64];
  SmallVectorBase<const_slang::ast::Type_*> local_70 [2];
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar6;
  
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  local_e0 = comp;
  local_d8 = context;
  local_c0 = (SimpleAssignmentPatternExpression *)type;
  sVar9 = Scope::membersOfType<slang::ast::FieldSymbol>(structScope);
  sVar6 = sVar9._M_end.current;
  while (sVar2 = local_70[0].len, src = sVar9._M_end.current,
        local_b0._0_8_ = sVar9._M_begin.current, (Symbol *)local_b0._0_8_ != sVar6.current) {
    local_d0._M_ptr = (pointer)DeclaredType::getType((DeclaredType *)(local_b0._0_8_ + 0x40));
    SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
              ((SmallVectorBase<slang::ast::Type_const*> *)local_70,(Type **)&local_d0);
    Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::increment
              ((specific_symbol_iterator<slang::ast::FieldSymbol> *)local_b0);
    sVar9._M_end.current = extraout_RDX.current;
    sVar9._M_begin.current = (Symbol *)local_b0._0_8_;
  }
  if (local_70[0].len == (syntax->items).elements._M_extent._M_extent_value + 1 >> 1) {
    direction = (uint)(local_d8->flags).m_bits >> 0x14 & Out;
    local_e1 = SUB41(direction,0);
    local_b0._0_8_ = local_b0 + 0x18;
    local_b0._8_8_ = 0;
    local_b0._16_8_ = 5;
    local_d0._M_extent._M_extent_value = 0;
    bVar8 = 0;
    uVar7 = 0;
    local_d0._M_ptr = (pointer)&syntax->items;
    while( true ) {
      pCVar1 = local_e0;
      if (local_d0._M_extent._M_extent_value == sVar2 &&
          (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)local_d0._M_ptr == &syntax->items)
      break;
      syntax_00 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                  iterator_base<const_slang::syntax::ExpressionSyntax_*>::dereference
                            ((iterator_base<const_slang::syntax::ExpressionSyntax_*> *)&local_d0);
      this = Expression::bindArgument
                       (*(Type **)((long)local_70[0].data_ + uVar7 * 8),direction,
                        (bitmask<slang::ast::VariableFlags>)0x0,syntax_00,local_d8);
      local_b8 = this;
      SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                ((SmallVectorBase<slang::ast::Expression_const*> *)local_b0,&local_b8);
      bVar3 = Expression::bad(this);
      bVar8 = bVar8 | bVar3;
      local_d0._M_extent._M_extent_value = local_d0._M_extent._M_extent_value + 1;
      uVar7 = (ulong)((int)uVar7 + 1);
      src.current = extraout_RDX_00;
    }
    iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)local_b0,
                       (EVP_PKEY_CTX *)local_e0,(EVP_PKEY_CTX *)src.current);
    local_d0._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
    ctx = local_c0;
    expr = BumpAllocator::
           emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,bool_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                     (&pCVar1->super_BumpAllocator,(Type *)local_c0,&local_e1,&local_d0,&sourceRange
                     );
    if (bVar8 != 0) {
      ctx = expr;
      expr = (SimpleAssignmentPatternExpression *)Expression::badExpr(pCVar1,(Expression *)expr);
    }
    SmallVectorBase<const_slang::ast::Expression_*>::cleanup
              ((SmallVectorBase<const_slang::ast::Expression_*> *)local_b0,(EVP_PKEY_CTX *)ctx);
  }
  else {
    pDVar5 = ASTContext::addDiag(local_d8,(DiagCode)0xae0007,sourceRange);
    pCVar1 = local_e0;
    pDVar5 = ast::operator<<(pDVar5,(Type *)local_c0);
    pDVar5 = Diagnostic::operator<<<unsigned_long>(pDVar5,local_70[0].len);
    Diagnostic::operator<<<unsigned_long>
              (pDVar5,(syntax->items).elements._M_extent._M_extent_value + 1 >> 1);
    ctx = (SimpleAssignmentPatternExpression *)0x0;
    expr = (SimpleAssignmentPatternExpression *)Expression::badExpr(pCVar1,(Expression *)0x0);
  }
  SmallVectorBase<const_slang::ast::Type_*>::cleanup(local_70,(EVP_PKEY_CTX *)ctx);
  return (Expression *)expr;
}

Assistant:

Expression& SimpleAssignmentPatternExpression::forStruct(
    Compilation& comp, const SimpleAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Scope& structScope, SourceRange sourceRange) {

    SmallVector<const Type*> types;
    for (auto& field : structScope.membersOfType<FieldSymbol>())
        types.push_back(&field.getType());

    if (types.size() != syntax.items.size()) {
        auto& diag = context.addDiag(diag::WrongNumberAssignmentPatterns, sourceRange);
        diag << type << types.size() << syntax.items.size();
        return badExpr(comp, nullptr);
    }

    const bool isLValue = context.flags.has(ASTFlags::LValue);
    auto direction = isLValue ? ArgumentDirection::Out : ArgumentDirection::In;

    bool bad = false;
    uint32_t index = 0;
    SmallVector<const Expression*> elems;
    for (auto item : syntax.items) {
        auto& expr = Expression::bindArgument(*types[index++], direction, {}, *item, context);
        elems.push_back(&expr);
        bad |= expr.bad();
    }

    auto result = comp.emplace<SimpleAssignmentPatternExpression>(type, isLValue, elems.copy(comp),
                                                                  sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}